

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.cpp
# Opt level: O3

void C_BackupCVars(void)

{
  int iVar1;
  undefined4 extraout_var;
  FBaseCVar *pFVar2;
  FCVarBackup backup;
  FCVarBackup local_30;
  
  if (CVarBackups.Count == 0) {
    FString::NullString.RefCount = FString::NullString.RefCount + 2;
    local_30.Name.Chars = FString::NullString.Nothing;
    local_30.String.Chars = FString::NullString.Nothing;
    if (CVars != (FBaseCVar *)0x0) {
      pFVar2 = CVars;
      do {
        if ((char)((pFVar2->Flags & 0x10) >> 4) == '\0' && (pFVar2->Flags & 0x44) != 0) {
          FString::operator=(&local_30.Name,pFVar2->Name);
          iVar1 = (*pFVar2->_vptr_FBaseCVar[4])(pFVar2,3);
          FString::operator=(&local_30.String,(char *)CONCAT44(extraout_var,iVar1));
          TArray<FCVarBackup,_FCVarBackup>::Push(&CVarBackups,&local_30);
        }
        pFVar2 = pFVar2->m_Next;
      } while (pFVar2 != (FBaseCVar *)0x0);
    }
    FString::~FString(&local_30.String);
    FString::~FString(&local_30.Name);
    return;
  }
  __assert_fail("CVarBackups.Size() == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/c_cvars.cpp"
                ,0x588,"void C_BackupCVars()");
}

Assistant:

void C_BackupCVars (void)
{
	assert(CVarBackups.Size() == 0);
	CVarBackups.Clear();

	FCVarBackup backup;

	for (FBaseCVar *cvar = CVars; cvar != NULL; cvar = cvar->m_Next)
	{
		if ((cvar->Flags & (CVAR_SERVERINFO|CVAR_DEMOSAVE)) && !(cvar->Flags & CVAR_LATCH))
		{
			backup.Name = cvar->GetName();
			backup.String = cvar->GetGenericRep(CVAR_String).String;
			CVarBackups.Push(backup);
		}
	}
}